

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

void __thiscall LTChannel::_Main(LTChannel *this)

{
  logLevelTy lVar1;
  long *in_RDI;
  
  *(undefined4 *)(in_RDI + 0x11) = 2;
  lVar1 = DataRefs::GetLogLevel(&dataRefs);
  if ((int)lVar1 < 1) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
           ,0xcc,"_Main",logDEBUG,"%s: Thread starts",in_RDI[0xd]);
  }
  (**(code **)(*in_RDI + 0x28))();
  lVar1 = DataRefs::GetLogLevel(&dataRefs);
  if ((int)lVar1 < 1) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
           ,0xce,"_Main",logDEBUG,"%s: Thread ends",in_RDI[0xd]);
  }
  *(undefined4 *)(in_RDI + 0x11) = 4;
  return;
}

Assistant:

void LTChannel::_Main()
{
    eThrStatus = THR_RUNNING;
    LOG_MSG(logDEBUG, "%s: Thread starts", pszChName);
    Main();
    LOG_MSG(logDEBUG, "%s: Thread ends", pszChName);
    eThrStatus = THR_ENDED;
}